

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Scaler::ByteSizeLong(Scaler *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  int value;
  int value_00;
  
  uVar2 = (ulong)(uint)(this->shiftvalue_).current_size_;
  lVar1 = uVar2 * 8;
  value_00 = 0;
  if (uVar2 == 0) {
    value = 0;
    lVar4 = 0;
  }
  else {
    value = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar4 = sVar3 + 1;
  }
  this->_shiftvalue_cached_byte_size_ = value;
  lVar4 = lVar4 + lVar1;
  uVar2 = (ulong)(uint)(this->scalevalue_).current_size_;
  lVar1 = uVar2 * 8;
  if (uVar2 != 0) {
    value_00 = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value_00);
    lVar4 = lVar4 + sVar3 + 1;
  }
  this->_scalevalue_cached_byte_size_ = value_00;
  sVar3 = lVar4 + lVar1;
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t Scaler::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Scaler)
  size_t total_size = 0;

  // repeated double shiftValue = 1;
  {
    unsigned int count = this->shiftvalue_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _shiftvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double scaleValue = 2;
  {
    unsigned int count = this->scalevalue_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _scalevalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}